

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

double sosqm(double *vec,int N)

{
  int local_24;
  double dStack_20;
  int i;
  double sos;
  int N_local;
  double *vec_local;
  
  dStack_20 = 0.0;
  for (local_24 = 0; local_24 < N; local_24 = local_24 + 1) {
    dStack_20 = vec[local_24] * vec[local_24] + dStack_20;
  }
  return dStack_20;
}

Assistant:

static double sosqm(double *vec, int N) {
	double sos;
	int i;
	sos = 0.0;

	for (i = 0; i < N;++i) {
		sos += (vec[i] * vec[i]);
	}

	return sos;
}